

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natpmp.cpp
# Opt level: O0

string * __thiscall
libtorrent::pcp_error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,pcp_error_category *this,int ev)

{
  char *__s;
  allocator<char> local_2d [16];
  allocator<char> local_1d;
  int local_1c;
  pcp_error_category *ppStack_18;
  int ev_local;
  pcp_error_category *this_local;
  
  local_1c = ev;
  ppStack_18 = this;
  this_local = (pcp_error_category *)__return_storage_ptr__;
  if ((ev < 0) || (0xd < ev)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unknown error",&local_1d);
    ::std::allocator<char>::~allocator(&local_1d);
  }
  else {
    __s = message::msgs[ev];
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,local_2d);
    ::std::allocator<char>::~allocator(local_2d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const override
	{
		static char const* msgs[] =
		{
			"success",
			"unsupported version",
			"not authorized",
			"malformed request",
			"unsupported opcode",
			"unsupported option",
			"malformed option",
			"network failure",
			"no resources",
			"unsupported protocol",
			"user exceeded quota",
			"cannot provide external",
			"address mismatch",
			"excessive remote peers",
		};
		if (ev < 0 || ev >= int(sizeof(msgs)/sizeof(msgs[0])))
			return "Unknown error";
		return msgs[ev];
	}